

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)56,_(unsigned_short)10>::Unpack
               (uint32_t **in,uint64_t *out)

{
  ushort uVar1;
  uint32_t *puVar2;
  uint6 uVar3;
  
  puVar2 = *in;
  uVar1 = *(ushort *)((long)puVar2 + 2);
  out[10] = (ulong)uVar1;
  *in = puVar2 + 1;
  uVar3 = CONCAT42(puVar2[1],uVar1);
  out[10] = (ulong)uVar3;
  *in = puVar2 + 2;
  out[10] = (ulong)CONCAT16((char)puVar2[2],uVar3);
  Unroller<(unsigned_short)56,_(unsigned_short)11>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}